

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O1

void shared_ownership2(shared_ptr<A> *s_ptr)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Took ownership of: ",0x13);
  poVar1 = operator<<((ostream *)&std::cout,
                      (s_ptr->super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uStack_18._0_7_ = CONCAT16(10,(undefined6)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 6),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"use_count: ",0xb);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void shared_ownership2(std::shared_ptr<A> s_ptr)
{
    std::cout << "Took ownership of: " << *s_ptr << '\n';
    std::cout << "use_count: " << s_ptr.use_count() << '\n';
}